

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

void cf_hc_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  long lVar1;
  long lVar2;
  cf_hc_baller *ballers [2];
  long local_38 [3];
  
  if ((cf->field_0x24 & 1) == 0) {
    local_38[0] = (long)cf->ctx + 0x28;
    local_38[1] = (long)cf->ctx + 0x58;
    lVar2 = 0;
    do {
      lVar1 = local_38[lVar2];
      if (((*(char *)(lVar1 + 0x2c) == '\x01') && (*(long *)(lVar1 + 8) != 0)) &&
         (*(int *)(lVar1 + 0x10) == 0)) {
        Curl_conn_cf_adjust_pollset(*(Curl_cfilter **)(lVar1 + 8),data,ps);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
       (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"adjust_pollset -> %d socks",(ulong)ps->num);
    }
  }
  return;
}

Assistant:

static void cf_hc_adjust_pollset(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  struct easy_pollset *ps)
{
  if(!cf->connected) {
    struct cf_hc_ctx *ctx = cf->ctx;
    struct cf_hc_baller *ballers[2];
    size_t i;

    ballers[0] = &ctx->h3_baller;
    ballers[1] = &ctx->h21_baller;
    for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
      struct cf_hc_baller *b = ballers[i];
      if(!cf_hc_baller_is_active(b))
        continue;
      Curl_conn_cf_adjust_pollset(b->cf, data, ps);
    }
    CURL_TRC_CF(data, cf, "adjust_pollset -> %d socks", ps->num);
  }
}